

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void __thiscall
duckdb::StandardColumnWriter<unsigned_short,_int,_duckdb::ParquetCastOperator>::FinalizeAnalyze
          (StandardColumnWriter<unsigned_short,_int,_duckdb::ParquetCastOperator> *this,
          ColumnWriterState *state_p)

{
  type tVar1;
  pointer puVar2;
  reference pvVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  
  pvVar3 = vector<duckdb_parquet::SchemaElement,_true>::operator[]
                     (&(((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                       file_meta_data).schema,
                      ((this->super_PrimitiveColumnWriter).super_ColumnWriter.column_schema)->
                      schema_index);
  tVar1 = pvVar3->type;
  puVar2 = state_p[2].definition_levels.
           super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if ((puVar2 == (pointer)0x0) ||
     (*(char *)&state_p[3].repetition_levels.
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage != '\0')) {
    AllocatedData::Reset((AllocatedData *)&state_p[2].is_empty);
    AllocatedData::Reset
              ((AllocatedData *)
               ((long)&state_p[2].is_empty.super_vector<bool,_std::allocator<bool>_>.
                       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                       _M_finish.super__Bit_iterator_base + 8));
    lVar4 = 0x188;
    uVar6 = 0;
    if ((((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->parquet_version != V1) &&
       (uVar7 = tVar1 - INT32, uVar6 = 0, uVar7 < 6)) {
      uVar6 = *(uint *)(&DAT_013cf954 + (ulong)uVar7 * 4);
    }
  }
  else {
    bVar5 = 0;
    do {
      bVar5 = bVar5 + 1;
    } while ((ulong)puVar2 >> (bVar5 & 0x3f) != 0);
    uVar6 = (uint)bVar5;
    lVar4 = 0xe0;
  }
  *(uint *)((long)&state_p->_vptr_ColumnWriterState + lVar4) = uVar6;
  return;
}

Assistant:

void FinalizeAnalyze(ColumnWriterState &state_p) override {
		const auto type = writer.GetType(SchemaIndex());

		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();
		if (state.dictionary.GetSize() == 0 || state.dictionary.IsFull()) {
			state.dictionary.Reset();
			if (writer.GetParquetVersion() == ParquetVersion::V1) {
				// Can't do the cool stuff for V1
				state.encoding = duckdb_parquet::Encoding::PLAIN;
			} else {
				// If we aren't doing dictionary encoding, these encodings are virtually always better than PLAIN
				switch (type) {
				case duckdb_parquet::Type::type::INT32:
				case duckdb_parquet::Type::type::INT64:
					state.encoding = duckdb_parquet::Encoding::DELTA_BINARY_PACKED;
					break;
				case duckdb_parquet::Type::type::BYTE_ARRAY:
					state.encoding = duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY;
					break;
				case duckdb_parquet::Type::type::FLOAT:
				case duckdb_parquet::Type::type::DOUBLE:
					state.encoding = duckdb_parquet::Encoding::BYTE_STREAM_SPLIT;
					break;
				default:
					state.encoding = duckdb_parquet::Encoding::PLAIN;
				}
			}
		} else {
			state.key_bit_width = RleBpDecoder::ComputeBitWidth(state.dictionary.GetSize());
		}
	}